

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

ssize_t __thiscall JetHead::Socket::read(Socket *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  undefined4 in_register_00000034;
  void *__buf_00;
  timeval *__timeout;
  ulong uVar5;
  timeval timeout;
  fd_set readSet;
  timeval local_c8;
  fd_set local_b8;
  
  __buf_00 = (void *)CONCAT44(in_register_00000034,__fd);
  local_c8.tv_sec = (__time_t)(uint)this->mReadTimeout;
  iVar4 = (int)__buf;
  if (local_c8.tv_sec == 0) {
    if (this->mSockStream == false) {
      uVar5 = ::recvfrom(this->mFd,__buf_00,(long)iVar4,0,(sockaddr *)&this->mLastDatagramSender,
                         (socklen_t *)&(this->mLastDatagramSender).mLen);
    }
    else {
      uVar5 = ::read(this->mFd,__buf_00,(long)iVar4);
    }
  }
  else {
    uVar5 = 0xffffffff;
    if (-1 < this->mReadTimeout) {
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[(uint)this->mFd >> 6] =
           local_b8.fds_bits[(uint)this->mFd >> 6] | 1L << ((byte)this->mFd & 0x3f);
      local_c8.tv_usec = 0;
      do {
        __timeout = &local_c8;
        if (this->mReadTimeout == 0) {
          __timeout = (timeval *)0x0;
        }
        iVar1 = select(0x400,&local_b8,(fd_set *)0x0,(fd_set *)0x0,__timeout);
        if (iVar1 != -1) {
          if (iVar1 != 0) {
            uVar3 = recv(this->mFd,__buf_00,(long)iVar4,0x4000);
            uVar5 = 0xffffffff;
            if (-1 < (int)uVar3) {
              uVar5 = uVar3 & 0xffffffff;
            }
          }
          break;
        }
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
    }
  }
  return uVar5 & 0xffffffff;
}

Assistant:

int Socket::read( void *buffer, int len )
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	if (mReadTimeout)
	{
		int retCode = 0;
		fd_set readSet;
		struct timeval timeout;
		int numBytes = 0;

		if( mReadTimeout < 0 ) 
		{
			return -1; // invalid timeout
		}

		FD_ZERO( &readSet );
		FD_SET( ( unsigned )mFd, &readSet );

		timeout.tv_sec = mReadTimeout;
		timeout.tv_usec = 0;

		while( true ) {
			if( mReadTimeout == 0 ) 
			{
				retCode = select( FD_SETSIZE, &readSet, NULL, NULL, NULL );
			} 
			else 
			{
				retCode = select( FD_SETSIZE, &readSet, NULL, NULL, &timeout );
			}

			if( retCode == 0 ) 
			{
				return -1; // timed out
			}
			if( retCode == -1 ) 
			{
				if( errno == EINTR )
					continue;
				
				return -1; // error
			} 
			else 
			{
				break; // continue with read 
			}
		}

		// read data
		numBytes = recv( mFd, buffer, len, MSG_NOSIGNAL );

		if( numBytes < 0 ) 
		{
			return -1; // socket error;
		}

		return numBytes;
	}
	else
	{
		if (not mSockStream)
		{
			return recvfrom(buffer, len, mLastDatagramSender);
		} else {
			return ::read(mFd, buffer, len);
		}
	}
}